

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

Channel * portfwd_raw_new(ConnectionLayer *cl,Plug **plug,_Bool start_ready)

{
  PortForwarding *pPVar1;
  
  pPVar1 = new_portfwd_state();
  (pPVar1->plug).vt = &PortForwarding_plugvt;
  (pPVar1->chan).initial_fixed_window_size = 0;
  (pPVar1->chan).vt = &PortForwarding_channelvt;
  pPVar1->c = (SshChannel *)0x0;
  pPVar1->cl = cl;
  pPVar1->input_wanted = true;
  pPVar1->ready = start_ready;
  *(undefined8 *)&pPVar1->socks_state = 0;
  *(undefined8 *)((long)&pPVar1->hostname + 4) = 0;
  *plug = &pPVar1->plug;
  return &pPVar1->chan;
}

Assistant:

Channel *portfwd_raw_new(ConnectionLayer *cl, Plug **plug, bool start_ready)
{
    struct PortForwarding *pf;

    pf = new_portfwd_state();
    pf->plug.vt = &PortForwarding_plugvt;
    pf->chan.initial_fixed_window_size = 0;
    pf->chan.vt = &PortForwarding_channelvt;
    pf->input_wanted = true;

    pf->c = NULL;

    pf->cl = cl;
    pf->input_wanted = true;
    pf->ready = start_ready;

    pf->socks_state = SOCKS_NONE;
    pf->hostname = NULL;
    pf->port = 0;

    *plug = &pf->plug;
    return &pf->chan;
}